

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void QHashPrivate::Node<QString,QVariant>::createInPlace<QVariant_const&>
               (Node<QString,_QVariant> *n,QString *k,QVariant *args)

{
  QVariant *in_RDX;
  QString *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  QString::QString(in_RDI,in_stack_ffffffffffffffd8);
  QVariant::QVariant((QVariant *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }